

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DMessageBoxMenu::Drawer(DMessageBoxMenu *this)

{
  EColorRange normalcolor;
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  EColorRange local_74;
  EColorRange local_54;
  PalEntry local_1c;
  int fontheight;
  PalEntry fade;
  int y;
  int i;
  DMessageBoxMenu *this_local;
  
  PalEntry::PalEntry(&local_1c,0);
  iVar3 = FFont::GetHeight(SmallFont);
  fontheight = 100;
  if (this->mMessage != (FBrokenLines *)0x0) {
    fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                   (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
    while (-1 < this->mMessage[(int)fade.field_0].Width) {
      iVar4 = FFont::GetHeight(SmallFont);
      fontheight = fontheight - iVar4 / 2;
      fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)((int)fade.field_0 + 1);
    }
    fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                   (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
    while (iVar4 = fontheight, pDVar2 = screen, pFVar1 = SmallFont,
          -1 < this->mMessage[(int)fade.field_0].Width) {
      iVar5 = this->mMessage[(int)fade.field_0].Width;
      pcVar7 = FString::operator_cast_to_char_(&this->mMessage[(int)fade.field_0].Text);
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,0xb,0xa0 - iVar5 / 2,iVar4,pcVar7,0x40001390,1,0);
      fontheight = iVar3 + fontheight;
      fade.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)((int)fade.field_0 + 1);
    }
  }
  if (this->mMessageMode == 0) {
    iVar4 = iVar3 + fontheight;
    this->mMouseY = iVar4;
    pDVar2 = screen;
    pFVar1 = SmallFont;
    if (this->messageSelection == 0) {
      local_54 = OptionSettings.mFontColorSelection;
    }
    else {
      local_54 = OptionSettings.mFontColor;
    }
    fontheight = iVar4;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_YES");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,local_54,0xa0,iVar4,pcVar7,0x40001390,1,0);
    pDVar2 = screen;
    pFVar1 = SmallFont;
    if (this->messageSelection == 1) {
      local_74 = OptionSettings.mFontColorSelection;
    }
    else {
      local_74 = OptionSettings.mFontColor;
    }
    iVar4 = fontheight + iVar3;
    pcVar7 = FStringTable::operator[](&GStrings,"TXT_NO");
    DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,local_74,0xa0,iVar4 + 1,pcVar7,0x40001390,1,0);
    pDVar2 = screen;
    pFVar1 = ConFont;
    normalcolor = OptionSettings.mFontColorSelection;
    if ((-1 < this->messageSelection) && (DMenu::MenuTime % 8 < 6)) {
      iVar4 = CleanXfac * -10;
      iVar5 = DCanvas::GetWidth((DCanvas *)screen);
      iVar3 = (fontheight + (iVar3 + 1) * this->messageSelection + iVar3 / 2 + -0x69) * CleanYfac;
      iVar6 = DCanvas::GetHeight((DCanvas *)screen);
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,normalcolor,iVar4 + iVar5 / 2,iVar3 + iVar6 / 2,
                        "\r",0x400013b8,CleanXfac << 3,0x400013b9,CleanYfac << 3,0);
    }
  }
  return;
}

Assistant:

void DMessageBoxMenu::Drawer ()
{
	int i, y;
	PalEntry fade = 0;

	int fontheight = SmallFont->GetHeight();
	//V_SetBorderNeedRefresh();
	//ST_SetNeedRefresh();

	y = 100;

	if (mMessage != NULL)
	{
		for (i = 0; mMessage[i].Width >= 0; i++)
			y -= SmallFont->GetHeight () / 2;

		for (i = 0; mMessage[i].Width >= 0; i++)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, 160 - mMessage[i].Width/2, y, mMessage[i].Text,
				DTA_Clean, true, TAG_DONE);
			y += fontheight;
		}
	}

	if (mMessageMode == 0)
	{
		y += fontheight;
		mMouseY = y;
		screen->DrawText(SmallFont, 
			messageSelection == 0? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y, GStrings["TXT_YES"], DTA_Clean, true, TAG_DONE);
		screen->DrawText(SmallFont, 
			messageSelection == 1? OptionSettings.mFontColorSelection : OptionSettings.mFontColor, 
			160, y + fontheight + 1, GStrings["TXT_NO"], DTA_Clean, true, TAG_DONE);

		if (messageSelection >= 0)
		{
			if ((DMenu::MenuTime%8) < 6)
			{
				screen->DrawText(ConFont, OptionSettings.mFontColorSelection,
					(150 - 160) * CleanXfac + screen->GetWidth() / 2,
					(y + (fontheight + 1) * messageSelection - 100 + fontheight/2 - 5) * CleanYfac + screen->GetHeight() / 2,
					"\xd",
					DTA_CellX, 8 * CleanXfac,
					DTA_CellY, 8 * CleanYfac,
					TAG_DONE);
			}
		}
	}
}